

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall embree::XMLWriter::store(XMLWriter *this,PointLight *light,ssize_t id)

{
  int in_EDX;
  long in_RSI;
  XMLWriter *in_RDI;
  allocator *name;
  XMLWriter *in_stack_fffffffffffffd90;
  string local_268 [32];
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  allocator local_1f1;
  string local_1f0 [32];
  int local_1d0;
  long local_1c8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined8 *local_168;
  undefined8 *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined8 *local_f0;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined8 *local_d8;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined8 *local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  name = &local_1f1;
  local_1c8 = in_RSI;
  local_1d0 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"PointLight",name);
  open(in_RDI,(char *)local_1f0,local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  local_188 = (undefined8 *)(local_1c8 + 0x10);
  local_180 = &local_248;
  local_170 = &local_1b8;
  local_138 = &one;
  local_108 = &embree::zero;
  local_110 = &embree::zero;
  local_c4 = 0x3f800000;
  local_c8 = 0;
  local_cc = 0;
  local_9c = 0;
  local_a0 = 0;
  local_a4 = 0;
  local_a8 = 0x3f800000;
  local_b8 = 0x3f800000;
  uStack_b0 = 0;
  local_1b8 = 0x3f800000;
  uStack_1b0 = 0;
  local_d8 = &local_1a8;
  local_118 = &embree::zero;
  local_140 = &one;
  local_120 = &embree::zero;
  local_dc = 0;
  local_e0 = 0x3f800000;
  local_e4 = 0;
  local_7c = 0;
  local_80 = 0;
  local_84 = 0x3f800000;
  local_88 = 0;
  local_98 = 0x3f80000000000000;
  uStack_90 = 0;
  local_1a8 = 0x3f80000000000000;
  uStack_1a0 = 0;
  local_f0 = &local_198;
  local_128 = &embree::zero;
  local_130 = &embree::zero;
  local_148 = &one;
  local_f4 = 0;
  local_f8 = 0;
  local_fc = 0x3f800000;
  local_5c = 0;
  local_60 = 0x3f800000;
  local_64 = 0;
  local_68 = 0;
  local_78 = 0;
  uStack_70 = 0x3f800000;
  local_198 = 0;
  uStack_190 = 0x3f800000;
  local_40 = &local_238;
  local_38 = &local_228;
  local_248 = 0x3f800000;
  uStack_240 = 0;
  local_20 = &local_1a8;
  local_238 = 0x3f80000000000000;
  uStack_230 = 0;
  local_30 = &local_198;
  local_228 = 0;
  uStack_220 = 0x3f800000;
  local_158 = &local_218;
  local_218 = *local_188;
  uStack_210 = *(undefined8 *)(local_1c8 + 0x18);
  local_178 = local_188;
  local_168 = local_180;
  local_160 = local_188;
  local_150 = local_170;
  local_c0 = local_170;
  local_58 = local_170;
  local_50 = local_180;
  local_48 = local_180;
  local_28 = local_38;
  local_18 = local_40;
  local_10 = local_170;
  local_8 = local_180;
  store(in_stack_fffffffffffffd90,(char *)name,(AffineSpace3fa *)in_RDI);
  store(in_stack_fffffffffffffd90,(char *)name,(Vec3fa *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"PointLight",(allocator *)&stack0xfffffffffffffd97);
  close(in_RDI,(int)local_268);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd97);
  return;
}

Assistant:

void XMLWriter::store(const SceneGraph::PointLight& light, ssize_t id)
  {
    open("PointLight",id);
    store("AffineSpace",AffineSpace3fa::translate(light.P));
    store("I",light.I);
    close("PointLight");
  }